

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O1

bool ImGui::SelectPath(char *popupId,string *path)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  pointer pcVar8;
  bool bVar9;
  string *s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_),
     iVar5 != 0)) {
    SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_._M_dataplus._M_p =
         (pointer)&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_,"<uninit>",""
              );
    __cxa_atexit(std::__cxx11::string::~string,
                 &SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_);
  }
  if (SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_ == '\0') {
    SelectPath();
  }
  bVar9 = false;
  bVar4 = BeginPopup(popupId,0);
  if (bVar4) {
    if (path->_M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)path);
    }
    else {
      LTRemoveXPSystemPath(path);
    }
    if ((1 < path->_M_string_length) &&
       ((path->_M_dataplus)._M_p[path->_M_string_length - 1] == '/')) {
      std::__cxx11::string::pop_back();
    }
    if ((SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_._M_string_length !=
         path->_M_string_length) ||
       ((SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_._M_string_length != 0 &&
        (iVar5 = bcmp(SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_._M_dataplus._M_p,
                      (path->_M_dataplus)._M_p,
                      SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_._M_string_length)
        , iVar5 != 0)))) {
      std::__cxx11::string::_M_assign
                ((string *)&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_);
      GetDirContents(&local_48,path,true);
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
    iVar5 = std::__cxx11::string::compare((char *)path);
    if (iVar5 == 0) {
      bVar9 = false;
      pbVar1 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar9 = false;
      bVar4 = Selectable(anon_var_dwarf_2685c5,false,0,(ImVec2 *)&local_68);
      pbVar1 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar4) {
        lVar6 = std::__cxx11::string::find_last_of((char *)path,0x29088f,0xffffffffffffffff);
        if (lVar6 == -1) {
          path->_M_string_length = 0;
          pcVar8 = (path->_M_dataplus)._M_p;
        }
        else {
          uVar7 = lVar6 + (ulong)(lVar6 == 0);
          if (path->_M_string_length < uVar7) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                       "basic_string::erase",uVar7);
          }
          path->_M_string_length = uVar7;
          pcVar8 = (path->_M_dataplus)._M_p + uVar7;
        }
        *pcVar8 = '\0';
        bVar9 = true;
        pbVar1 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    for (; pbVar3 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        pbVar1 != SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
      bVar4 = Selectable((pbVar1->_M_dataplus)._M_p,false,0,(ImVec2 *)&local_68);
      if (bVar4) {
        iVar5 = std::__cxx11::string::compare((char *)path);
        if (iVar5 != 0) {
          std::__cxx11::string::push_back((char)path);
        }
        std::__cxx11::string::_M_append((char *)path,(ulong)(pbVar1->_M_dataplus)._M_p);
        bVar9 = true;
      }
      pbVar2 = SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
    }
    SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    EndPopup();
  }
  return bVar9;
}

Assistant:

IMGUI_API bool SelectPath (const char* popupId, std::string& path)
{
    static std::string _p ("<uninit>");
    static std::vector<std::string> _l;

    bool ret = false;
    if (BeginPopup(popupId))
    {
        // Replace an empty path with X-Plane's root
        if (path.empty())
            path = dataRefs.GetXPSystemPath();
        // If a path starts with system path, strip the system path
        else {
#if IBM
            // Replace any backslashes with forward slashes as XP seems to do that internally, too
            for (char& c : path)
                if (c == '\\') c = '/';
            // except for the one after the drive letter
            if (path.length() >= 2 && path[1] == ':') {
                // Windows drive letter -> upper case
                path[0] = (char)toupper(path[0]);
                // that slash afterwards needs to be a backslash
                if (path.length() >= 3 && path[2] == '/')
                    path[2] = '\\';
            }
#endif
            LTRemoveXPSystemPath(path);
        }
        
        // make sure path doesn't end on slash
        // (but keep a single slash for "root"...and as the one after a Windows drive letter is kept as backslash it won't be removed either
        if (path.size() > 1 && path.back() == '/')
            path.pop_back();
        
        // make sure we have the proper list of subdirectories
        if (_p != path) {
            _p = path;
            _l = GetDirContents(path,true);
        }
        
        // Can we offer a "dir up" entry?
#if IBM
        if (path.size() > 3 && path[1] == ':')
#else
        if (path != "/")
#endif
        {
            if (Selectable(ICON_FA_LEVEL_UP_ALT)) {
                size_t lastSlash = path.find_last_of(PATH_DELIMS);
                if (lastSlash != std::string::npos)
                    path.erase(std::max(lastSlash, size_t(1)));// one level up, but keep a single slash for root
                else
                    path.clear();                   // nothing left
                ret = true;                         // something selected
            }
        }
        
        // Subdirs of that path, as a Listbox
        for (const std::string& s: _l) {
            if (Selectable(s.c_str())) {
                if (path != "/")
                    path += '/';                // always use forward slash, also on Windows
                path += s;                      // one level down
                ret = true;                     // something selected
            }
        }
        
        EndPopup();
    }
    
    return ret;
}